

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O1

CMNode * __thiscall
xercesc_4_0::DFAContentModel::buildSyntaxTree
          (DFAContentModel *this,ContentSpecNode *curNode,uint *curIndex)

{
  uint uVar1;
  int iVar2;
  MemoryManager *pMVar3;
  ContentSpecNode *curNode_00;
  ContentSpecNode *pCVar4;
  uint uVar5;
  CMBinaryOp *this_00;
  CMLeaf *pCVar6;
  QName *pQVar7;
  ulong uVar8;
  ContentSpecNode *curNode_01;
  CMStateSet *pCVar9;
  CMBinaryOp *leftToAdopt;
  CMNode *pCVar10;
  CMStateSet *pCVar11;
  CMNode *this_01;
  RuntimeException *this_02;
  NodeTypes type;
  int iVar12;
  CMStateSetEnumerator enumLast;
  int local_68;
  CMStateSetEnumerator local_48;
  
  type = curNode->fType;
  if ((uint)((type & (Any_NS|Any_Other)) + ~Sequence) < 3) {
    this_00 = (CMBinaryOp *)XMemory::operator_new(0x38,this->fMemoryManager);
    CMAny::CMAny((CMAny *)this_00,type,curNode->fElement->fURIId,*curIndex,this->fLeafCount,
                 this->fMemoryManager);
    pCVar6 = (CMLeaf *)XMemory::operator_new(0x40,this->fMemoryManager);
    pQVar7 = (QName *)XMemory::operator_new(0x48,this->fMemoryManager);
    QName::QName(pQVar7,L"",L"",curNode->fElement->fURIId,this->fMemoryManager);
    uVar5 = *curIndex;
    uVar1 = this->fLeafCount;
    (pCVar6->super_CMNode).fMemoryManager = this->fMemoryManager;
    (pCVar6->super_CMNode).fType = Leaf;
    (pCVar6->super_CMNode).fFirstPos = (CMStateSet *)0x0;
    (pCVar6->super_CMNode).fLastPos = (CMStateSet *)0x0;
    (pCVar6->super_CMNode).fMaxStates = uVar1;
    (pCVar6->super_CMNode)._vptr_CMNode = (_func_int **)&PTR__CMLeaf_00418ea0;
    pCVar6->fPosition = uVar5;
    pCVar6->fAdopt = true;
    pCVar6->fElement = pQVar7;
    (pCVar6->super_CMNode).fIsNullable = uVar5 == 0xfffffffe;
    uVar8 = (ulong)*curIndex;
    this->fLeafList[uVar8] = pCVar6;
  }
  else if (type == Loop) {
    this_00 = (CMBinaryOp *)XMemory::operator_new(0x48,this->fMemoryManager);
    pQVar7 = curNode->fFirst->fElement;
    iVar12 = curNode->fMinOccurs;
    iVar2 = curNode->fMaxOccurs;
    uVar5 = *curIndex;
    uVar1 = this->fLeafCount;
    pMVar3 = this->fMemoryManager;
    (this_00->super_CMNode).fMemoryManager = pMVar3;
    (this_00->super_CMNode).fType = Leaf;
    (this_00->super_CMNode).fFirstPos = (CMStateSet *)0x0;
    (this_00->super_CMNode).fLastPos = (CMStateSet *)0x0;
    (this_00->super_CMNode).fMaxStates = uVar1;
    (this_00->super_CMNode).fIsNullable = false;
    (this_00->super_CMNode)._vptr_CMNode = (_func_int **)&PTR__CMLeaf_00418ea0;
    this_00->fLeftChild = (CMNode *)0x0;
    *(uint *)&this_00->fRightChild = uVar5;
    *(undefined1 *)((long)&this_00->fRightChild + 4) = 0;
    if (pQVar7 == (QName *)0x0) {
      pQVar7 = (QName *)XMemory::operator_new(0x48,pMVar3);
      QName::QName(pQVar7,L"",L"",0xfffffffe,(this_00->super_CMNode).fMemoryManager);
      this_00->fLeftChild = (CMNode *)pQVar7;
      *(undefined1 *)((long)&this_00->fRightChild + 4) = 1;
    }
    else {
      this_00->fLeftChild = (CMNode *)pQVar7;
    }
    (this_00->super_CMNode).fIsNullable = *(int *)&this_00->fRightChild == -2;
    (this_00->super_CMNode)._vptr_CMNode = (_func_int **)&PTR__CMLeaf_00418f60;
    *(int *)&this_00[1].super_CMNode._vptr_CMNode = iVar12;
    *(int *)((long)&this_00[1].super_CMNode._vptr_CMNode + 4) = iVar2;
    pCVar6 = (CMLeaf *)XMemory::operator_new(0x48,this->fMemoryManager);
    pQVar7 = curNode->fFirst->fElement;
    iVar12 = curNode->fMinOccurs;
    iVar2 = curNode->fMaxOccurs;
    uVar5 = *curIndex;
    uVar1 = this->fLeafCount;
    pMVar3 = this->fMemoryManager;
    (pCVar6->super_CMNode).fMemoryManager = pMVar3;
    (pCVar6->super_CMNode).fType = Leaf;
    (pCVar6->super_CMNode).fFirstPos = (CMStateSet *)0x0;
    (pCVar6->super_CMNode).fLastPos = (CMStateSet *)0x0;
    (pCVar6->super_CMNode).fMaxStates = uVar1;
    (pCVar6->super_CMNode).fIsNullable = false;
    (pCVar6->super_CMNode)._vptr_CMNode = (_func_int **)&PTR__CMLeaf_00418ea0;
    pCVar6->fElement = (QName *)0x0;
    pCVar6->fPosition = uVar5;
    pCVar6->fAdopt = false;
    if (pQVar7 == (QName *)0x0) {
      pQVar7 = (QName *)XMemory::operator_new(0x48,pMVar3);
      QName::QName(pQVar7,L"",L"",0xfffffffe,(pCVar6->super_CMNode).fMemoryManager);
      pCVar6->fElement = pQVar7;
      pCVar6->fAdopt = true;
    }
    else {
      pCVar6->fElement = pQVar7;
    }
    (pCVar6->super_CMNode).fIsNullable = pCVar6->fPosition == 0xfffffffe;
    (pCVar6->super_CMNode)._vptr_CMNode = (_func_int **)&PTR__CMLeaf_00418f60;
    *(int *)&pCVar6[1].super_CMNode._vptr_CMNode = iVar12;
    *(int *)((long)&pCVar6[1].super_CMNode._vptr_CMNode + 4) = iVar2;
    uVar8 = (ulong)*curIndex;
    this->fLeafList[uVar8] = pCVar6;
    type = curNode->fFirst->fType;
  }
  else {
    if (type != Leaf) {
      curNode_00 = curNode->fSecond;
      local_68 = 0;
      curNode_01 = curNode;
      if (curNode->fType == Sequence) {
        local_68 = 0;
        do {
          pCVar4 = curNode_01->fFirst;
          if ((pCVar4 == (ContentSpecNode *)0x0) || (pCVar4->fSecond != curNode_00)) break;
          local_68 = local_68 + 1;
          curNode_01 = pCVar4;
        } while (pCVar4->fType == Sequence);
      }
      if (local_68 == 0) {
        if ((type & (Any_NS|Any)) == Choice) {
          pCVar10 = buildSyntaxTree(this,curNode->fFirst,curIndex);
          this_01 = buildSyntaxTree(this,curNode_00,curIndex);
          if ((type & (Any_NS|Any_Other)) == Sequence) {
            pCVar9 = CMNode::getLastPos(pCVar10);
            pCVar11 = CMNode::getFirstPos(this_01);
            CMStateSetEnumerator::CMStateSetEnumerator(&local_48,pCVar9,0);
            if (local_48.fLastValue != 0) {
              do {
                uVar5 = CMStateSetEnumerator::nextElement(&local_48);
                CMStateSet::operator|=(this->fFollowList[uVar5],pCVar11);
              } while (local_48.fLastValue != 0);
            }
          }
          this_00 = (CMBinaryOp *)XMemory::operator_new(0x40,this->fMemoryManager);
          CMBinaryOp::CMBinaryOp(this_00,type,pCVar10,this_01,this->fLeafCount,this->fMemoryManager)
          ;
        }
        else {
          if (3 < (uint)type) {
            this_02 = (RuntimeException *)__cxa_allocate_exception(0x30);
            RuntimeException::RuntimeException
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/DFAContentModel.cpp"
                       ,0x67d,CM_UnknownCMSpecType,this->fMemoryManager);
            __cxa_throw(this_02,&RuntimeException::typeinfo,XMLException::~XMLException);
          }
          pCVar10 = buildSyntaxTree(this,curNode->fFirst,curIndex);
          if (type != ZeroOrOne) {
            pCVar9 = CMNode::getFirstPos(pCVar10);
            pCVar11 = CMNode::getLastPos(pCVar10);
            CMStateSetEnumerator::CMStateSetEnumerator(&local_48,pCVar11,0);
            if (local_48.fLastValue != 0) {
              do {
                uVar5 = CMStateSetEnumerator::nextElement(&local_48);
                CMStateSet::operator|=(this->fFollowList[uVar5],pCVar9);
              } while (local_48.fLastValue != 0);
            }
          }
          this_00 = (CMBinaryOp *)XMemory::operator_new(0x38,this->fMemoryManager);
          CMUnaryOp::CMUnaryOp
                    ((CMUnaryOp *)this_00,type,pCVar10,this->fLeafCount,this->fMemoryManager);
        }
      }
      else {
        leftToAdopt = (CMBinaryOp *)buildSyntaxTree(this,curNode_01,curIndex);
        iVar12 = 0;
        do {
          pCVar10 = buildSyntaxTree(this,curNode_00,curIndex);
          if ((leftToAdopt->super_CMNode).fLastPos == (CMStateSet *)0x0) {
            pCVar9 = (CMStateSet *)
                     XMemory::operator_new(0x20,(leftToAdopt->super_CMNode).fMemoryManager);
            CMStateSet::CMStateSet
                      (pCVar9,(ulong)(leftToAdopt->super_CMNode).fMaxStates,
                       (leftToAdopt->super_CMNode).fMemoryManager);
            (leftToAdopt->super_CMNode).fLastPos = pCVar9;
            (*(leftToAdopt->super_CMNode)._vptr_CMNode[4])(leftToAdopt,pCVar9);
          }
          pCVar9 = (leftToAdopt->super_CMNode).fLastPos;
          if (pCVar10->fFirstPos == (CMStateSet *)0x0) {
            pCVar11 = (CMStateSet *)XMemory::operator_new(0x20,pCVar10->fMemoryManager);
            CMStateSet::CMStateSet(pCVar11,(ulong)pCVar10->fMaxStates,pCVar10->fMemoryManager);
            pCVar10->fFirstPos = pCVar11;
            (*pCVar10->_vptr_CMNode[3])(pCVar10,pCVar11);
          }
          pCVar11 = pCVar10->fFirstPos;
          CMStateSetEnumerator::CMStateSetEnumerator(&local_48,pCVar9,0);
          while (local_48.fLastValue != 0) {
            uVar5 = CMStateSetEnumerator::nextElement(&local_48);
            CMStateSet::operator|=(this->fFollowList[uVar5],pCVar11);
          }
          this_00 = (CMBinaryOp *)XMemory::operator_new(0x40,this->fMemoryManager);
          CMBinaryOp::CMBinaryOp
                    (this_00,Sequence,&leftToAdopt->super_CMNode,pCVar10,this->fLeafCount,
                     this->fMemoryManager);
          iVar12 = iVar12 + 1;
          leftToAdopt = this_00;
        } while (iVar12 != local_68);
      }
      if (local_68 != 0) {
        return &this_00->super_CMNode;
      }
      goto LAB_002f2397;
    }
    this_00 = (CMBinaryOp *)XMemory::operator_new(0x40,this->fMemoryManager);
    pQVar7 = curNode->fElement;
    uVar5 = *curIndex;
    uVar1 = this->fLeafCount;
    pMVar3 = this->fMemoryManager;
    (this_00->super_CMNode).fMemoryManager = pMVar3;
    (this_00->super_CMNode).fType = Leaf;
    (this_00->super_CMNode).fFirstPos = (CMStateSet *)0x0;
    (this_00->super_CMNode).fLastPos = (CMStateSet *)0x0;
    (this_00->super_CMNode).fMaxStates = uVar1;
    (this_00->super_CMNode).fIsNullable = false;
    (this_00->super_CMNode)._vptr_CMNode = (_func_int **)&PTR__CMLeaf_00418ea0;
    this_00->fLeftChild = (CMNode *)0x0;
    *(uint *)&this_00->fRightChild = uVar5;
    *(undefined1 *)((long)&this_00->fRightChild + 4) = 0;
    if (pQVar7 == (QName *)0x0) {
      pQVar7 = (QName *)XMemory::operator_new(0x48,pMVar3);
      QName::QName(pQVar7,L"",L"",0xfffffffe,(this_00->super_CMNode).fMemoryManager);
      this_00->fLeftChild = (CMNode *)pQVar7;
      *(undefined1 *)((long)&this_00->fRightChild + 4) = 1;
    }
    else {
      this_00->fLeftChild = (CMNode *)pQVar7;
    }
    (this_00->super_CMNode).fIsNullable = *(int *)&this_00->fRightChild == -2;
    pCVar6 = (CMLeaf *)XMemory::operator_new(0x40,this->fMemoryManager);
    pQVar7 = curNode->fElement;
    uVar5 = *curIndex;
    uVar1 = this->fLeafCount;
    pMVar3 = this->fMemoryManager;
    (pCVar6->super_CMNode).fMemoryManager = pMVar3;
    (pCVar6->super_CMNode).fType = Leaf;
    (pCVar6->super_CMNode).fFirstPos = (CMStateSet *)0x0;
    (pCVar6->super_CMNode).fLastPos = (CMStateSet *)0x0;
    (pCVar6->super_CMNode).fMaxStates = uVar1;
    (pCVar6->super_CMNode).fIsNullable = false;
    (pCVar6->super_CMNode)._vptr_CMNode = (_func_int **)&PTR__CMLeaf_00418ea0;
    pCVar6->fElement = (QName *)0x0;
    pCVar6->fPosition = uVar5;
    pCVar6->fAdopt = false;
    if (pQVar7 == (QName *)0x0) {
      pQVar7 = (QName *)XMemory::operator_new(0x48,pMVar3);
      QName::QName(pQVar7,L"",L"",0xfffffffe,(pCVar6->super_CMNode).fMemoryManager);
      pCVar6->fElement = pQVar7;
      pCVar6->fAdopt = true;
    }
    else {
      pCVar6->fElement = pQVar7;
    }
    (pCVar6->super_CMNode).fIsNullable = pCVar6->fPosition == 0xfffffffe;
    uVar8 = (ulong)*curIndex;
    this->fLeafList[uVar8] = pCVar6;
    type = Leaf;
  }
  this->fLeafListType[uVar8] = type;
  *curIndex = (int)uVar8 + 1;
LAB_002f2397:
  if ((this_00->super_CMNode).fFirstPos == (CMStateSet *)0x0) {
    pCVar9 = (CMStateSet *)XMemory::operator_new(0x20,(this_00->super_CMNode).fMemoryManager);
    CMStateSet::CMStateSet
              (pCVar9,(ulong)(this_00->super_CMNode).fMaxStates,
               (this_00->super_CMNode).fMemoryManager);
    (this_00->super_CMNode).fFirstPos = pCVar9;
    (*(this_00->super_CMNode)._vptr_CMNode[3])(this_00,pCVar9);
  }
  if ((this_00->super_CMNode).fLastPos == (CMStateSet *)0x0) {
    pCVar9 = (CMStateSet *)XMemory::operator_new(0x20,(this_00->super_CMNode).fMemoryManager);
    CMStateSet::CMStateSet
              (pCVar9,(ulong)(this_00->super_CMNode).fMaxStates,
               (this_00->super_CMNode).fMemoryManager);
    (this_00->super_CMNode).fLastPos = pCVar9;
    (*(this_00->super_CMNode)._vptr_CMNode[4])(this_00,pCVar9);
  }
  (*(this_00->super_CMNode)._vptr_CMNode[2])(this_00);
  return &this_00->super_CMNode;
}

Assistant:

CMNode* DFAContentModel::buildSyntaxTree(ContentSpecNode* const curNode
                                         , unsigned int&        curIndex)
{
    // Initialize a return node pointer
    CMNode* retNode = 0;

    // Get the spec type of the passed node
    const ContentSpecNode::NodeTypes curType = curNode->getType();

    if ((curType & 0x0f) == ContentSpecNode::Any
        || (curType & 0x0f) == ContentSpecNode::Any_Other
        || (curType & 0x0f) == ContentSpecNode::Any_NS)
    {
        retNode = new (fMemoryManager) CMAny
        (
            curType
            , curNode->getElement()->getURI()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        fLeafList[curIndex] = new (fMemoryManager) CMLeaf
        (
            new (fMemoryManager) QName
            (
                XMLUni::fgZeroLenString
                , XMLUni::fgZeroLenString
                , curNode->getElement()->getURI()
                , fMemoryManager
            )
            , curIndex
            , true
            , fLeafCount
            , fMemoryManager
        );
        fLeafListType[curIndex] = curType;
        ++curIndex;
    }
    else if (curType == ContentSpecNode::Leaf)
    {
        //
        //  Create a new leaf node, and pass it the current leaf count, which
        //  is its DFA state position. Bump the leaf count after storing it.
        //  This makes the positions zero based since we store first and then
        //  increment.
        //
        retNode = new (fMemoryManager) CMLeaf
        (
            curNode->getElement()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        try
        {
            fLeafList[curIndex] = new (fMemoryManager) CMLeaf
            (
                curNode->getElement()
                , curIndex
                , fLeafCount
                , fMemoryManager
            );
        }
        catch( const OutOfMemoryException& )
        {
            delete retNode;
            throw;
        }
        fLeafListType[curIndex] = ContentSpecNode::Leaf;
        ++curIndex;
    }
    else if (curType == ContentSpecNode::Loop)
    {
        //
        //  Create a new leaf node, and pass it the current leaf count, which
        //  is its DFA state position. Bump the leaf count after storing it.
        //  This makes the positions zero based since we store first and then
        //  increment.
        //
        retNode = new (fMemoryManager) CMRepeatingLeaf
        (
            curNode->getFirst()->getElement()
            , curNode->getMinOccurs()
            , curNode->getMaxOccurs()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        fLeafList[curIndex] = new (fMemoryManager) CMRepeatingLeaf
        (
            curNode->getFirst()->getElement()
            , curNode->getMinOccurs()
            , curNode->getMaxOccurs()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        fLeafListType[curIndex] = curNode->getFirst()->getType();
        ++curIndex;
    }
     else
    {
        //
        //  Its not a leaf, so we have to recurse its left and maybe right
        //  nodes. Save both values before we recurse and trash the node.
        //
        ContentSpecNode* leftNode = curNode->getFirst();
        ContentSpecNode* rightNode = curNode->getSecond();

        // Detect if we have a deep tree that can be analyzed using a loop instead of recursion
        unsigned int nLoopCount=0;
        ContentSpecNode* cursor=curNode;
        while(cursor->getType()==ContentSpecNode::Sequence && cursor->getFirst() && cursor->getFirst()->getSecond()==rightNode)
        {
            nLoopCount++;
            cursor=cursor->getFirst();
        }
        if(nLoopCount!=0)
        {
            retNode = buildSyntaxTree(cursor, curIndex);
            for(unsigned int i=0;i<nLoopCount;i++)
            {
                CMNode* newRight = nullptr;
                try
                {
                    newRight = buildSyntaxTree(rightNode, curIndex);

                    //
                    //  Now handle our level. We use our left child's last pos set and our
                    //  right child's first pos set, so get them now for convenience.
                    //
                    const CMStateSet& last  = retNode->getLastPos();
                    const CMStateSet& first = newRight->getFirstPos();

                    //
                    //  Now, for every position which is in our left child's last set
                    //  add all of the states in our right child's first set to the
                    //  follow set for that position.
                    //
                    CMStateSetEnumerator enumLast(&last);
                    while(enumLast.hasMoreElements())
                    {
                        XMLSize_t index=enumLast.nextElement();
                        *fFollowList[index] |= first;
                    }

                    retNode = new (fMemoryManager) CMBinaryOp
                    (
                        ContentSpecNode::Sequence
                        , retNode
                        , newRight
                        , fLeafCount
                        , fMemoryManager
                    );
                }
                catch( const OutOfMemoryException& )
                {
                    delete newRight;
                    delete retNode;
                    throw;
                }
            }
            return retNode;
        }

        if (((curType & 0x0f) == ContentSpecNode::Choice)
        ||   ((curType & 0x0f) == ContentSpecNode::Sequence))
        {
            //
            //  Recurse on both children, and return a binary op node with the
            //  two created sub nodes as its children. The node type is the
            //  same type as the source.
            //
            CMNode* newLeft = buildSyntaxTree(leftNode, curIndex);
            CMNode* newRight;
            try
            {
                newRight = buildSyntaxTree(rightNode, curIndex);
            }
            catch( const OutOfMemoryException& )
            {
                delete newLeft;
                throw;
            }
            if(((curType & 0x0f) == ContentSpecNode::Sequence))
            {
                //
                //  Now handle our level. We use our left child's last pos set and our
                //  right child's first pos set, so get them now for convenience.
                //
                const CMStateSet& last  = newLeft->getLastPos();
                const CMStateSet& first = newRight->getFirstPos();

                //
                //  Now, for every position which is in our left child's last set
                //  add all of the states in our right child's first set to the
                //  follow set for that position.
                //
                CMStateSetEnumerator enumLast(&last);
                while(enumLast.hasMoreElements())
                {
                    XMLSize_t index=enumLast.nextElement();
                    *fFollowList[index] |= first;
                }
            }
            try
            {
                retNode = new (fMemoryManager) CMBinaryOp
                (
                    curType
                    , newLeft
                    , newRight
                    , fLeafCount
                    , fMemoryManager
                );
            }
            catch( const OutOfMemoryException& )
            {
                delete newLeft;
                delete newRight;
                throw;
            }
        }
         else if (curType == ContentSpecNode::ZeroOrMore
               || curType == ContentSpecNode::ZeroOrOne
               || curType == ContentSpecNode::OneOrMore)
        {
            CMNode* newChild = buildSyntaxTree(leftNode, curIndex);
            if (curType == ContentSpecNode::ZeroOrMore
               || curType == ContentSpecNode::OneOrMore)
            {
                //
                //  Now handle our level. We use our own first and last position
                //  sets, so get them up front.
                //
                const CMStateSet& first = newChild->getFirstPos();
                const CMStateSet& last  = newChild->getLastPos();

                //
                //  For every position which is in our last position set, add all
                //  of our first position states to the follow set for that
                //  position.
                //
                CMStateSetEnumerator enumLast(&last);
                while(enumLast.hasMoreElements())
                {
                    XMLSize_t index=enumLast.nextElement();
                    *fFollowList[index] |= first;
                }
            }
            // This one is fine as is, just change to our form
            retNode = new (fMemoryManager) CMUnaryOp
            (
                curType
                , newChild
                , fLeafCount
                , fMemoryManager
            );
        }
         else
        {
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);
        }
    }
    // fault in the first and last pos, then delete it children
    try
    {
        retNode->getFirstPos();
        retNode->getLastPos();
        retNode->orphanChild();
    }
    catch( const OutOfMemoryException& )
    {
        delete retNode;
        throw;
    }
    return retNode;
}